

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<long_double> * __thiscall
TPZVec<long_double>::operator=(TPZVec<long_double> *this,TPZVec<long_double> *rval)

{
  longdouble *plVar1;
  longdouble *plVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (longdouble *)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar5 = this->fNElements;
      lVar4 = 0;
      plVar2 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4);
      this->fStore = plVar2;
      plVar1 = rval->fStore;
      uVar3 = 0;
      if (0 < (long)uVar5) {
        uVar3 = uVar5;
      }
      while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
        *(unkbyte10 *)((long)plVar2 + lVar4) = *(unkbyte10 *)((long)plVar1 + lVar4);
        lVar4 = lVar4 + 0x10;
      }
    }
    else {
      this->fStore = rval->fStore;
      uVar5 = this->fNElements;
    }
    this->fNAlloc = uVar5;
    rval->fStore = (longdouble *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}